

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

LONGLONG quick_select_longlong(LONGLONG *arr,int n)

{
  LONGLONG LVar1;
  int iVar2;
  int iVar3;
  LONGLONG t_6;
  LONGLONG t_5;
  LONGLONG t_4;
  LONGLONG t_3;
  LONGLONG t_2;
  LONGLONG t_1;
  LONGLONG t;
  int hh;
  int ll;
  int middle;
  int median;
  int high;
  int low;
  int n_local;
  LONGLONG *arr_local;
  
  low = 0;
  high = n + -1;
  iVar2 = high / 2;
  while( true ) {
    if (high <= low) {
      return arr[iVar2];
    }
    if (high == low + 1) break;
    iVar3 = (low + high) / 2;
    if (arr[high] < arr[iVar3]) {
      LVar1 = arr[iVar3];
      arr[iVar3] = arr[high];
      arr[high] = LVar1;
    }
    if (arr[high] < arr[low]) {
      LVar1 = arr[low];
      arr[low] = arr[high];
      arr[high] = LVar1;
    }
    if (arr[low] < arr[iVar3]) {
      LVar1 = arr[iVar3];
      arr[iVar3] = arr[low];
      arr[low] = LVar1;
    }
    LVar1 = arr[iVar3];
    arr[iVar3] = arr[low + 1];
    arr[low + 1] = LVar1;
    ll = low + 1;
    hh = high;
    while( true ) {
      do {
        ll = ll + 1;
        iVar3 = hh;
      } while (arr[ll] < arr[low]);
      do {
        hh = iVar3;
        iVar3 = hh + -1;
      } while (arr[low] < arr[iVar3]);
      if (iVar3 < ll) break;
      LVar1 = arr[ll];
      arr[ll] = arr[iVar3];
      arr[iVar3] = LVar1;
      hh = iVar3;
    }
    LVar1 = arr[low];
    arr[low] = arr[iVar3];
    arr[iVar3] = LVar1;
    if (iVar3 <= iVar2) {
      low = ll;
    }
    if (iVar2 <= iVar3) {
      high = hh + -2;
    }
  }
  if (arr[high] < arr[low]) {
    LVar1 = arr[low];
    arr[low] = arr[high];
    arr[high] = LVar1;
  }
  return arr[iVar2];
}

Assistant:

static LONGLONG quick_select_longlong(LONGLONG arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}